

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O2

int __thiscall
calc4::anon_unknown_0::Visitor<__int128>::ProcessOperator
          (Visitor<__int128> *this,shared_ptr<const_calc4::Operator> *op)

{
  int iVar1;
  element_type *peVar2;
  _Elt_pointer piVar3;
  
  peVar2 = (op->super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (**peVar2->_vptr_Operator)(peVar2,this);
  piVar3 = (this->stack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (this->stack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (this->stack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  iVar1 = piVar3[-1];
  std::deque<int,_std::allocator<int>_>::pop_back(&(this->stack).c);
  return iVar1;
}

Assistant:

int ProcessOperator(const std::shared_ptr<const Operator>& op)
    {
        op->Accept(*this);
        int result = stack.top();
        stack.pop();
        return result;
    }